

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TileWire.cpp
# Opt level: O3

void __thiscall TileWire::updateWire(TileWire *this,State state)

{
  uint uVar1;
  undefined1 *puVar2;
  long lVar3;
  long lVar4;
  
  if ((long)(int)this->_type == 4) {
    uVar1 = this->_updateTimestamp1;
    if (this->_updateTimestamp1 != Tile::currentUpdateTime) {
      (*(this->super_Tile)._vptr_Tile[9])(this,0,state);
      uVar1 = Tile::currentUpdateTime;
    }
    lVar4 = 1;
    if (this->_updateTimestamp2 != uVar1) {
LAB_0013cf88:
      (*(this->super_Tile)._vptr_Tile[9])(this,lVar4,state);
      return;
    }
  }
  else {
    puVar2 = &(&this->super_Tile)[(long)(int)(this->super_Tile)._direction * 2].field_0x21 +
             (long)(int)this->_type * 0x10;
    lVar4 = 0;
    do {
      lVar3 = 0;
      do {
        if (puVar2[lVar3] == '\x01') goto LAB_0013cf88;
        lVar3 = lVar3 + 1;
      } while (lVar3 != 4);
      lVar4 = lVar4 + 1;
      puVar2 = puVar2 + 4;
    } while (lVar4 != 4);
  }
  return;
}

Assistant:

void TileWire::updateWire(State state) {
    if (_type == CROSSOVER) {
        if (_updateTimestamp1 != Tile::currentUpdateTime) {    // For crossover, check both paths for update time mismatch.
            followWire(NORTH, state);
        }
        if (_updateTimestamp2 != Tile::currentUpdateTime) {
            followWire(EAST, state);
        }
    } else {
        for (int i = 0; i < 4; ++i) {    // Check combinations of entry and exit directions through this wire until one works out.
            const bool* exitDirections = CONNECTION_INFO[_direction][_type][i];
            for (int j = 0; j < 4; ++j) {
                if (exitDirections[j] == true) {
                    followWire(static_cast<Direction>(i), state);
                    return;
                }
            }
        }
    }
}